

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
MatchAndExplain<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *lhs,MatchResultListener *listener)

{
  ostream *os;
  bool bVar1;
  int iVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  it_1;
  uchar *puVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  it_2;
  long lVar4;
  uchar *puVar5;
  uchar *puVar6;
  char *pcVar7;
  const_iterator it;
  uchar *puVar8;
  char *pcVar9;
  
  puVar8 = (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = *(uchar **)this;
  puVar6 = *(uchar **)(this + 8);
  if (((long)puVar5 - (long)puVar8 != (long)puVar6 - (long)puVar3) ||
     ((bVar1 = true, puVar5 != puVar8 &&
      (iVar2 = bcmp(puVar8,puVar3,(long)puVar5 - (long)puVar8), iVar2 != 0)))) {
    os = listener->stream_;
    if (os != (ostream *)0x0) {
      if (puVar8 == puVar5) {
        pcVar9 = "which";
      }
      else {
        bVar1 = false;
        do {
          puVar3 = *(uchar **)this;
          puVar6 = *(uchar **)(this + 8);
          if (puVar3 != puVar6) {
            do {
              if (*puVar3 == *puVar8) {
                if (puVar3 != puVar6) goto LAB_0011eb5b;
                break;
              }
              puVar3 = puVar3 + 1;
            } while (puVar3 != puVar6);
          }
          if (bVar1) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (os,"which has these unexpected elements: ",0x25);
            bVar1 = true;
          }
          PrintTo(*puVar8,os);
          puVar5 = (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
LAB_0011eb5b:
          puVar8 = puVar8 + 1;
        } while (puVar8 != puVar5);
        puVar3 = *(uchar **)this;
        puVar6 = *(uchar **)(this + 8);
        pcVar9 = "which";
        if (bVar1) {
          pcVar9 = ",\nand";
        }
      }
      if (puVar3 != puVar6) {
        bVar1 = false;
        do {
          puVar8 = (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          puVar5 = (lhs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (puVar8 != puVar5) {
            do {
              if (*puVar8 == *puVar3) {
                if (puVar8 != puVar5) goto LAB_0011ec06;
                break;
              }
              puVar8 = puVar8 + 1;
            } while (puVar8 != puVar5);
          }
          if (bVar1) {
            lVar4 = 2;
            pcVar7 = ", ";
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,5);
            lVar4 = 0x27;
            pcVar7 = " doesn\'t have these expected elements: ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar7,lVar4);
          PrintTo(*puVar3,os);
          puVar6 = *(uchar **)(this + 8);
          bVar1 = true;
LAB_0011ec06:
          puVar3 = puVar3 + 1;
        } while (puVar3 != puVar6);
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }